

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_resources.cpp
# Opt level: O2

bool dxil_spv::emit_create_handle_for_lib_instruction(Impl *impl,CallInst *instruction)

{
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  iterator __it;
  iterator iVar4;
  CallInst *local_30;
  CallInst *instruction_local;
  
  local_30 = instruction;
  instruction_local = instruction;
  sVar3 = std::
          _Hashtable<const_LLVMBC::Value_*,_const_LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::Value_*>,_std::__detail::_Identity,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&(impl->llvm_annotate_handle_lib_uses)._M_h,(key_type *)&local_30);
  bVar2 = true;
  if (sVar3 == 0) {
    bVar1 = resource_handle_needs_sink(impl,instruction);
    if (bVar1) {
      __it = std::
             _Hashtable<const_LLVMBC::CallInst_*,_const_LLVMBC::CallInst_*,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::CallInst_*>,_std::__detail::_Identity,_std::equal_to<const_LLVMBC::CallInst_*>,_std::hash<const_LLVMBC::CallInst_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::find(&(impl->resource_handles_needing_sink)._M_h,&instruction_local);
      std::
      _Hashtable<const_LLVMBC::CallInst_*,_const_LLVMBC::CallInst_*,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::CallInst_*>,_std::__detail::_Identity,_std::equal_to<const_LLVMBC::CallInst_*>,_std::hash<const_LLVMBC::CallInst_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::erase(&(impl->resource_handles_needing_sink)._M_h,
              (const_iterator)__it.super__Node_iterator_base<const_LLVMBC::CallInst_*,_false>._M_cur
             );
    }
    else {
      local_30 = (CallInst *)LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
      iVar4 = std::
              _Hashtable<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(impl->llvm_global_variable_to_resource_mapping)._M_h,(key_type *)&local_30);
      if (iVar4.
          super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
          ._M_cur == (__node_type *)0x0) {
        bVar2 = false;
      }
      else {
        bVar2 = emit_create_handle(impl,instruction,
                                   *(ResourceType *)
                                    ((long)iVar4.
                                           super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
                                           ._M_cur + 0x10),
                                   *(uint *)((long)iVar4.
                                                  super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
                                                  ._M_cur + 0x14),
                                   *(Value **)
                                    ((long)iVar4.
                                           super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
                                           ._M_cur + 0x18),
                                   *(bool *)((long)iVar4.
                                                  super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
                                                  ._M_cur + 0x28));
      }
    }
  }
  return bVar2;
}

Assistant:

bool emit_create_handle_for_lib_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	// Defer creating any handles since annotateHandle is actually going to do it.
	if (impl.llvm_annotate_handle_lib_uses.count(instruction))
		return true;

	if (resource_handle_needs_sink(impl, instruction))
	{
		impl.resource_handles_needing_sink.erase(impl.resource_handles_needing_sink.find(instruction));
		return true;
	}

	auto itr = impl.llvm_global_variable_to_resource_mapping.find(instruction->getOperand(1));
	if (itr == impl.llvm_global_variable_to_resource_mapping.end())
		return false;

	return emit_create_handle(impl, instruction, itr->second.type,
	                          itr->second.meta_index, itr->second.offset, itr->second.non_uniform);
}